

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderTermCmp(Fts3SegReader *pSeg,char *zTerm,int nTerm)

{
  int local_20;
  int res;
  int nTerm_local;
  char *zTerm_local;
  Fts3SegReader *pSeg_local;
  
  local_20 = 0;
  if (pSeg->aNode != (char *)0x0) {
    if (nTerm < pSeg->nTerm) {
      local_20 = memcmp(pSeg->zTerm,zTerm,(long)nTerm);
    }
    else {
      local_20 = memcmp(pSeg->zTerm,zTerm,(long)pSeg->nTerm);
    }
    if (local_20 == 0) {
      local_20 = pSeg->nTerm - nTerm;
    }
  }
  return local_20;
}

Assistant:

static int fts3SegReaderTermCmp(
  Fts3SegReader *pSeg,            /* Segment reader object */
  const char *zTerm,              /* Term to compare to */
  int nTerm                       /* Size of term zTerm in bytes */
){
  int res = 0;
  if( pSeg->aNode ){
    if( pSeg->nTerm>nTerm ){
      res = memcmp(pSeg->zTerm, zTerm, nTerm);
    }else{
      res = memcmp(pSeg->zTerm, zTerm, pSeg->nTerm);
    }
    if( res==0 ){
      res = pSeg->nTerm-nTerm;
    }
  }
  return res;
}